

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_consumer.cpp
# Opt level: O2

void __thiscall duckdb::ColumnDataConsumer::InitializeScan(ColumnDataConsumer *this)

{
  idx_t __n;
  pointer pCVar1;
  ulong uVar2;
  unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
  *segment;
  pointer this_00;
  ulong local_50;
  ColumnDataConsumer *local_48;
  pointer local_40;
  _Head_base<0UL,_duckdb::ColumnDataCollectionSegment_*,_false> local_38;
  
  __n = ColumnDataCollection::ChunkCount(this->collection);
  this->chunk_count = __n;
  this->current_chunk_index = 0;
  this->chunk_delete_index = 0xffffffffffffffff;
  ::std::
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  ::reserve(&(this->chunk_references).
             super_vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
            ,__n);
  local_40 = (this->collection->segments).
             super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = this;
  for (this_00 = (this->collection->segments).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != local_40;
      this_00 = this_00 + 1) {
    uVar2 = 0;
    while( true ) {
      local_50 = uVar2;
      pCVar1 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
               ::operator->(this_00);
      if ((ulong)(((long)(pCVar1->chunk_data).
                         super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                         .
                         super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar1->chunk_data).
                        super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>.
                        super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x58) <= uVar2) break;
      local_38._M_head_impl =
           (this_00->
           super_unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnDataCollectionSegment_*,_std::default_delete<duckdb::ColumnDataCollectionSegment>_>
           .super__Head_base<0UL,_duckdb::ColumnDataCollectionSegment_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::ColumnDataConsumer::ChunkReference,std::allocator<duckdb::ColumnDataConsumer::ChunkReference>>
      ::emplace_back<duckdb::ColumnDataCollectionSegment*,unsigned_long&>
                ((vector<duckdb::ColumnDataConsumer::ChunkReference,std::allocator<duckdb::ColumnDataConsumer::ChunkReference>>
                  *)&this->chunk_references,&local_38._M_head_impl,&local_50);
      uVar2 = local_50 + 1;
    }
  }
  ::std::
  __sort<__gnu_cxx::__normal_iterator<duckdb::ColumnDataConsumer::ChunkReference*,std::vector<duckdb::ColumnDataConsumer::ChunkReference,std::allocator<duckdb::ColumnDataConsumer::ChunkReference>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((local_48->chunk_references).
             super_vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
             .
             super__Vector_base<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (local_48->chunk_references).
             super_vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
             .
             super__Vector_base<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void ColumnDataConsumer::InitializeScan() {
	chunk_count = collection.ChunkCount();
	current_chunk_index = 0;
	chunk_delete_index = DConstants::INVALID_INDEX;

	// Initialize chunk references and sort them, so we can scan them in a sane order, regardless of how it was created
	chunk_references.reserve(chunk_count);
	for (auto &segment : collection.GetSegments()) {
		for (idx_t chunk_index = 0; chunk_index < segment->chunk_data.size(); chunk_index++) {
			chunk_references.emplace_back(segment.get(), chunk_index);
		}
	}
	std::sort(chunk_references.begin(), chunk_references.end());
}